

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O2

vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
obj::load_from_file<float>
          (vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
           *__return_storage_ptr__,string *file)

{
  ifstream is;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&is,(string *)file,_S_in);
  if ((abStack_1f8[*(long *)(_is + -0x18)] & 5) == 0) {
    load_from_stream<float>(__return_storage_ptr__,(istream *)&is);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  std::ifstream::~ifstream(&is);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Tri<T, 3>> load_from_file(const std::string& file) {
    std::ifstream is(file);
    if (is)
        return load_from_stream<T>(is);
    return std::vector<Tri<T, 3>>();
}